

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagholder.cpp
# Opt level: O2

Value * __thiscall
camp::TagHolder::tag(Value *__return_storage_ptr__,TagHolder *this,Value *id,UserObject *object)

{
  const_iterator cVar1;
  
  cVar1 = std::
          _Rb_tree<camp::Value,_std::pair<const_camp::Value,_camp::detail::Getter<camp::Value>_>,_std::_Select1st<std::pair<const_camp::Value,_camp::detail::Getter<camp::Value>_>_>,_std::less<camp::Value>,_std::allocator<std::pair<const_camp::Value,_camp::detail::Getter<camp::Value>_>_>_>
          ::find(&(this->m_tags)._M_t,id);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->m_tags)._M_t._M_impl.super__Rb_tree_header) {
    Value::Value(__return_storage_ptr__,(Value *)Value::nothing);
  }
  else {
    detail::Getter<camp::Value>::get
              (__return_storage_ptr__,(Getter<camp::Value> *)&cVar1._M_node[2]._M_right,object);
  }
  return __return_storage_ptr__;
}

Assistant:

Value TagHolder::tag(const Value& id, const UserObject& object) const
{
    TagsTable::const_iterator it = m_tags.find(id);
    if (it != m_tags.end())
        return it->second.get(object);

    return Value::nothing;
}